

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  long lVar1;
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  long in_RDI;
  string_view sVar2;
  dec_writer in_stack_00000000;
  int num_digits;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffffbc [12];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 in_stack_ffffffffffffffe8 [12];
  
  uVar3 = *(undefined8 *)(in_RDI + 0x10);
  uVar4 = *(undefined8 *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff18;
  n._0_8_ = in_stack_ffffffffffffff10;
  count_digits((uint128_t)n);
  sVar2 = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x28becd);
  lVar1 = *(long *)(in_RDI + 8);
  prefix._4_12_ = in_stack_ffffffffffffffbc;
  prefix.data_._0_4_ = *(undefined4 *)(lVar1 + 0x20);
  specs.type = (char)uVar3;
  specs._9_3_ = (int3)((ulong)uVar3 >> 8);
  specs.fill.data_[0] = (int)((ulong)uVar3 >> 0x20);
  specs.width = (int)sVar2.size_;
  specs.precision = (int)(sVar2.size_ >> 0x20);
  specs.fill.data_[1] = (int)uVar4;
  specs.fill.data_[2] = (int)((ulong)uVar4 >> 0x20);
  specs.fill.data_[3] = in_stack_ffffffffffffffe8._0_4_;
  specs.fill.data_[4] = in_stack_ffffffffffffffe8._4_4_;
  specs.fill.data_[5] = in_stack_ffffffffffffffe8._8_4_;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>
            (*(basic_writer<fmt::v6::buffer_range<wchar_t>_> **)(lVar1 + 0x18),
             (int)((ulong)*(undefined8 *)(lVar1 + 0x10) >> 0x20),prefix,specs,in_stack_00000000);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }